

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O2

void web_server_callback(http_parser_t *parser,http_message_t *req,SOCKINFO *info)

{
  char cVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  int64_t iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  UpnpFileInfo *p;
  char *in;
  size_t sVar10;
  UpnpListHead *pUVar11;
  char *extraout_RAX;
  ListNode *pLVar12;
  UpnpExtraHeaders *p_00;
  UpnpListHead *elt;
  UpnpListIter pos;
  http_header_t *phVar13;
  off_t oVar14;
  char *pcVar15;
  ushort **ppuVar16;
  SendInstruction *pSVar17;
  long lVar18;
  int64_t iVar19;
  char *fmt;
  char *RetPtr;
  LinkedList *pLVar20;
  ulong uVar21;
  xml_alias_t *pxVar22;
  char *pcVar23;
  xml_alias_t *pxVar24;
  long lVar25;
  undefined8 uVar26;
  virtualDirList **ppvVar27;
  ulong uVar28;
  byte bVar29;
  char *pcVar30;
  char *pcVar31;
  char *pcVar32;
  char *local_750;
  int timeout;
  int resp_minor;
  int resp_major;
  http_parser_t *local_718;
  SOCKINFO *local_710;
  off_t local_708;
  undefined4 local_6fc;
  LinkedList *local_6f8;
  time_t aux_LastModified;
  long local_6e8;
  int64_t F;
  membuffer filename;
  membuffer headers;
  long local_678;
  http_message_t *local_670;
  char *local_668;
  size_t dummy;
  SendInstruction RespInstr;
  xml_alias_t xmldoc;
  char Buf [1024];
  
  bVar29 = 0;
  local_718 = parser;
  local_710 = info;
  memset(&RespInstr,0,0x1d0);
  membuffer_init(&headers);
  membuffer_init(&filename);
  print_http_headers(req);
  if ((HTTPMETHOD_SIMPLEGET < req->method) || ((0x101cU >> (req->method & 0x1f) & 1) == 0)) {
    __assert_fail("req->method == HTTPMETHOD_GET || req->method == HTTPMETHOD_HEAD || req->method == HTTPMETHOD_POST || req->method == HTTPMETHOD_SIMPLEGET"
                  ,".upnp/src/genlib/net/http/webserver.c",0x4ba,
                  "int process_request(SOCKINFO *, http_message_t *, enum resp_type *, membuffer *, membuffer *, struct xml_alias_t *, struct SendInstruction *)"
                 );
  }
  p = UpnpFileInfo_new();
  http_CalcResponseVersion(req->major_version,req->minor_version,&resp_major,&resp_minor);
  sVar10 = (req->uri).pathquery.size;
  in = (char *)malloc(sVar10 + 1);
  if (in == (char *)0x0) goto LAB_0010f085;
  memcpy(in,(req->uri).pathquery.buff,sVar10);
  in[sVar10] = '\0';
  dummy = sVar10;
  remove_escaped_chars(in,&dummy);
  iVar6 = remove_dots(in,(req->uri).pathquery.size);
  if (iVar6 != 0) {
    local_750 = (char *)0x0;
    bVar4 = false;
    iVar6 = 0x193;
    goto LAB_0010f09e;
  }
  if (*in == '/') {
    ppvVar27 = &pVirtualDirList;
LAB_0010efef:
    do {
      do {
        ppvVar27 = &((virtualDirList *)ppvVar27)->next->next;
        if ((virtualDirList *)ppvVar27 == (virtualDirList *)0x0) {
          bVar4 = false;
          if (gAliasDoc.doc.buf != (char *)0x0) {
            pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
            if (gAliasDoc.doc.buf == (char *)0x0) {
              __assert_fail("is_valid_alias(&gAliasDoc)",".upnp/src/genlib/net/http/webserver.c",
                            0x18a,"void alias_grab(struct xml_alias_t *)");
            }
            pxVar22 = &gAliasDoc;
            pxVar24 = &xmldoc;
            for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pxVar24->name).buf = (pxVar22->name).buf;
              pxVar22 = (xml_alias_t *)((long)pxVar22 + ((ulong)bVar29 * -2 + 1) * 8);
              pxVar24 = (xml_alias_t *)((long)pxVar24 + (ulong)bVar29 * -0x10 + 8);
            }
            *xmldoc.ct = *xmldoc.ct + 1;
            pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
            iVar6 = strcmp(xmldoc.name.buf,in);
            bVar4 = true;
            if (iVar6 == 0) {
              UpnpFileInfo_set_FileLength(p,xmldoc.doc.length);
              UpnpFileInfo_set_IsDirectory(p,0);
              bVar4 = true;
              UpnpFileInfo_set_IsReadable(p,1);
              UpnpFileInfo_set_LastModified(p,xmldoc.last_modified);
              UpnpFileInfo_set_ContentType(p,"text/xml; charset=\"utf-8\"");
              pcVar23 = UpnpFileInfo_get_ContentType(p);
              local_6fc = 0;
              if (pcVar23 == (char *)0x0) goto LAB_0010fffb;
              goto LAB_0010f818;
            }
          }
          if ((gDocumentRootDir.length != 0) &&
             (iVar6 = membuffer_assign_str(&filename,gDocumentRootDir.buf), iVar6 == 0)) {
            uVar7 = membuffer_append_str(&filename,in);
            pcVar23 = (char *)(ulong)uVar7;
            if (uVar7 != 0) goto LAB_0010fffb;
            while ((filename.length != 0 &&
                   (pcVar23 = filename.buf, filename.buf[filename.length - 1] == '/'))) {
              membuffer_delete(&filename,filename.length - 1,1);
              pcVar23 = extraout_RAX;
            }
            local_6fc = (undefined4)CONCAT71((int7)((ulong)pcVar23 >> 8),1);
            if (req->method == HTTPMETHOD_POST) goto LAB_0010f818;
            iVar6 = get_file_info(filename.buf,p);
            if (iVar6 != 0) goto LAB_0010fed4;
            iVar6 = UpnpFileInfo_get_IsDirectory(p);
            if (iVar6 != 0) {
              pcVar23 = "/index.html";
              if (filename.buf[filename.length - 1] == '/') {
                pcVar23 = "index.html";
              }
              iVar6 = membuffer_append_str(&filename,pcVar23);
              if (iVar6 != 0) goto LAB_0010fffb;
              iVar6 = get_file_info(filename.buf,p);
              if ((iVar6 != 0) || (iVar6 = UpnpFileInfo_get_IsDirectory(p), iVar6 != 0))
              goto LAB_0010fed4;
            }
            iVar8 = UpnpFileInfo_get_IsReadable(p);
            goto joined_r0x00110292;
          }
          goto LAB_0010fffb;
        }
        pcVar23 = ((virtualDirList *)ppvVar27)->dirName;
        sVar10 = strlen(pcVar23);
      } while (sVar10 == 0);
      cVar1 = pcVar23[sVar10 - 1];
      iVar6 = strncmp(pcVar23,in,sVar10);
      if (cVar1 != '/') goto LAB_0010f02e;
    } while (iVar6 != 0);
    goto LAB_0010f04e;
  }
  iVar6 = 400;
  goto LAB_0010f09b;
LAB_0010f02e:
  if (((iVar6 != 0) || (0x3f < (ulong)(byte)in[sVar10])) ||
     ((0x8000800000000001U >> ((ulong)(byte)in[sVar10] & 0x3f) & 1) == 0)) goto LAB_0010efef;
LAB_0010f04e:
  RespInstr.Cookie = ((virtualDirList *)ppvVar27)->cookie;
  RespInstr.IsVirtualFile = 1;
  iVar6 = membuffer_assign_str(&filename,in);
  if (iVar6 == 0) {
    local_6fc = 1;
    bVar4 = false;
    if (req->method != HTTPMETHOD_POST) {
      pUVar11 = UpnpFileInfo_get_ExtraHeadersList(p);
      pLVar20 = &req->headers;
      pLVar12 = ListHead(pLVar20);
      local_6f8 = pLVar20;
      local_670 = req;
      for (; pLVar12 != (ListNode *)0x0; pLVar12 = ListNext(pLVar20,pLVar12)) {
        puVar2 = (undefined8 *)pLVar12->item;
        iVar6 = map_str_to_int((char *)*puVar2,puVar2[1],Http_Header_Names,0x21,0);
        if (iVar6 < 0) {
          p_00 = UpnpExtraHeaders_new();
          if (p_00 == (UpnpExtraHeaders *)0x0) {
            FreeExtraHTTPHeaders(pUVar11);
            goto LAB_0010f085;
          }
          elt = UpnpExtraHeaders_get_node(p_00);
          pos = UpnpListEnd(pUVar11);
          req = local_670;
          UpnpListInsert(pUVar11,pos,elt);
          UpnpExtraHeaders_strncpy_name(p_00,(char *)*puVar2,puVar2[1]);
          UpnpExtraHeaders_strncpy_value(p_00,(char *)puVar2[3],puVar2[4]);
          pLVar20 = local_6f8;
        }
      }
      UpnpFileInfo_set_CtrlPtIPAddr(p,&local_710->foreign_sockaddr);
      phVar13 = httpmsg_find_hdr(req,0x18,(memptr *)Buf);
      if (phVar13 != (http_header_t *)0x0) {
        UpnpFileInfo_strncpy_Os(p,(char *)Buf._0_8_,Buf._8_8_);
      }
      iVar6 = (*virtualDirCallback.get_info)
                        (filename.buf,p,RespInstr.Cookie,&RespInstr.RequestCookie);
      local_750 = (char *)0x0;
      if (iVar6 != 0) {
LAB_0010f7fb:
        bVar4 = false;
LAB_0010fed4:
        local_750 = (char *)0x0;
        iVar6 = 0x194;
        goto LAB_0010f09e;
      }
      iVar6 = UpnpFileInfo_get_IsDirectory(p);
      if (iVar6 != 0) {
        pcVar23 = "/index.html";
        if (filename.buf[filename.length - 1] == '/') {
          pcVar23 = "index.html";
        }
        iVar6 = membuffer_append_str(&filename,pcVar23);
        if (iVar6 != 0) goto LAB_0010f085;
        iVar6 = (*virtualDirCallback.get_info)
                          (filename.buf,p,RespInstr.Cookie,&RespInstr.RequestCookie);
        if (iVar6 != 0) goto LAB_0010f7fb;
        iVar8 = UpnpFileInfo_get_IsDirectory(p);
        bVar4 = false;
        iVar6 = 0x194;
        if (iVar8 != 0) goto LAB_0010f09e;
      }
      iVar8 = UpnpFileInfo_get_IsReadable(p);
      bVar4 = false;
joined_r0x00110292:
      local_750 = (char *)0x0;
      iVar6 = 0x193;
      if (iVar8 == 0) goto LAB_0010f09e;
    }
LAB_0010f818:
    RespInstr.CorsHeader = (void *)gWebserverCorsString.length;
    if (gWebserverCorsString.length != 0) {
      RespInstr.CorsHeader = gWebserverCorsString.buf;
    }
    RespInstr.ReadSendSize = UpnpFileInfo_get_FileLength(p);
    oVar14 = UpnpFileInfo_get_FileLength(p);
    local_6f8 = (LinkedList *)0xb4;
    local_750 = (char *)malloc(0xb4);
    if (local_750 == (char *)0x0) {
LAB_0010fffb:
      local_750 = (char *)0x0;
      iVar6 = 500;
      goto LAB_0010f09e;
    }
    pLVar12 = ListHead(&req->headers);
    local_6e8 = oVar14 + -1;
    local_708 = oVar14;
    for (; pLVar12 != (ListNode *)0x0; pLVar12 = ListNext(&req->headers,pLVar12)) {
      puVar2 = (undefined8 *)pLVar12->item;
      uVar7 = map_str_to_int((char *)*puVar2,puVar2[1],Http_Header_Names,0x21,0);
      pLVar20 = (LinkedList *)puVar2[4];
      if (local_6f8 <= pLVar20) {
        free(local_750);
        pLVar20 = (LinkedList *)puVar2[4];
        local_6f8 = (LinkedList *)((long)&(pLVar20->head).prev + 1);
        local_750 = (char *)malloc((size_t)local_6f8);
        if (local_750 == (char *)0x0) {
          local_750 = (char *)0x0;
          iVar6 = 500;
          goto LAB_0010f09e;
        }
      }
      memcpy(local_750,(void *)puVar2[3],(size_t)pLVar20);
      local_750[puVar2[4]] = '\0';
      if (-1 < (int)uVar7) {
        iVar6 = Http_Header_Names[uVar7].id;
        if (iVar6 == 3) {
          iVar6 = atoi(local_750);
          RespInstr.RecvWriteSize = (long)iVar6;
        }
        else if (iVar6 == 0x1c) {
          if (puVar2[4] + 1 < 0xc9) {
            memcpy(RespInstr.AcceptLanguageHeader,local_750,puVar2[4] + 1);
          }
          else {
            memcpy(RespInstr.AcceptLanguageHeader,local_750,199);
            RespInstr.AcceptLanguageHeader[199] = '\0';
          }
        }
        else if (iVar6 == 0x23) {
          RespInstr.IsRangeActive = 1;
          RespInstr.ReadSendSize = local_708;
          pcVar23 = strdup(local_750);
          if (pcVar23 == (char *)0x0) {
LAB_00110134:
            iVar6 = 500;
            goto LAB_0010fd77;
          }
          pcVar15 = StrStr(pcVar23,"bytes");
          if ((pcVar15 == (char *)0x0) || (pcVar15 = StrStr(pcVar23,"="), pcVar15 == (char *)0x0)) {
            free(pcVar23);
            RespInstr.IsRangeActive = 0;
            iVar6 = 400;
            goto LAB_0010fd77;
          }
          pcVar31 = pcVar15 + 1;
          if (local_708 < 0) {
            iVar6 = 0x1a0;
            if (((*pcVar31 == '0') && (pcVar15[2] == '-')) && (pcVar15[3] == '\0')) {
              RespInstr.IsRangeActive = 0;
              iVar6 = 200;
              bVar3 = true;
            }
            else {
              bVar3 = false;
            }
            free(pcVar23);
            if (!bVar3) goto LAB_0010fd77;
          }
          else {
            F = -1;
            local_678 = -1;
            pcVar15 = strchr(pcVar31,0x2c);
            if (pcVar15 != (char *)0x0) {
              *pcVar15 = '\0';
            }
            pcVar15 = strchr(pcVar31,0x2d);
            if (pcVar15 == (char *)0x0) {
              free(pcVar23);
              iVar6 = 0x1a0;
              goto LAB_0010fd77;
            }
            *pcVar15 = ' ';
            __isoc99_sscanf(pcVar31,"%ld%ld",&F,&local_678);
            lVar18 = local_678;
            iVar5 = F;
            iVar19 = iVar5;
            lVar25 = lVar18;
            if (local_678 == -1 || F == -1) {
              *pcVar15 = '-';
              local_668 = pcVar31;
              sVar10 = strlen(pcVar31);
              uVar21 = sVar10 & 0xffffffff;
              if ((int)sVar10 < 1) {
                uVar21 = 0;
              }
              uVar28 = 0;
              do {
                iVar19 = lVar18;
                lVar25 = iVar5;
                if ((uVar21 == uVar28) || (cVar1 = local_668[uVar28], (long)cVar1 == 0x2d)) break;
                ppuVar16 = __ctype_b_loc();
                uVar28 = uVar28 + 1;
                iVar19 = iVar5;
                lVar25 = lVar18;
              } while ((*(byte *)((long)*ppuVar16 + (long)cVar1 * 2 + 1) & 8) == 0);
            }
            if (local_708 < iVar19) {
              free(pcVar23);
              iVar6 = 0x1a0;
              goto LAB_0010fd77;
            }
            if (((iVar19 < 0) || (lVar25 < 0)) || (lVar25 < iVar19)) {
              if (((local_708 - iVar19 == 0 || local_708 < iVar19) || (iVar19 < 0)) ||
                 (lVar18 = local_708 - iVar19, lVar25 != -1)) {
                if ((iVar19 != -1) || (lVar25 < 1)) {
                  free(pcVar23);
                  iVar6 = 0x1a0;
                  goto LAB_0010fd77;
                }
                iVar19 = local_708 - lVar25;
                lVar18 = lVar25;
                if (iVar19 == 0 || local_708 < lVar25) {
                  RespInstr.RangeOffset = 0;
                  RespInstr.ReadSendSize = local_708;
                  uVar7 = snprintf(RespInstr.RangeHeader,200,"CONTENT-RANGE: bytes 0-%ld/%ld\r\n",
                                   local_6e8);
                  goto joined_r0x0010fd2e;
                }
              }
              RespInstr.ReadSendSize = lVar18;
              RespInstr.RangeOffset = iVar19;
              uVar7 = snprintf(RespInstr.RangeHeader,200,"CONTENT-RANGE: bytes %ld-%ld/%ld\r\n",
                               iVar19,local_6e8,local_708);
            }
            else {
              if (local_708 <= lVar25) {
                lVar25 = local_6e8;
              }
              RespInstr.ReadSendSize = (lVar25 - iVar19) + 1;
              RespInstr.RangeOffset = iVar19;
              uVar7 = snprintf(RespInstr.RangeHeader,200,"CONTENT-RANGE: bytes %ld-%ld/%ld\r\n");
            }
joined_r0x0010fd2e:
            if (199 < uVar7) {
              free(pcVar23);
              goto LAB_00110134;
            }
            free(pcVar23);
          }
        }
        else if (iVar6 == 0x24) {
          RespInstr.IsChunkActive = 1;
          sVar10 = strlen(local_750);
          if ((4 < sVar10) && (pcVar23 = StrStr(local_750,"trailers"), pcVar23 != (char *)0x0)) {
            RespInstr.IsTrailers = 1;
          }
        }
      }
    }
    iVar6 = 200;
LAB_0010fd77:
    free(local_750);
    local_750 = (char *)0x0;
    if (iVar6 != 200) goto LAB_0010f09e;
    if (req->method == HTTPMETHOD_POST) {
      local_750 = (char *)0x4;
    }
    else {
      if (((virtualDirList *)ppvVar27 != (virtualDirList *)0x0) &&
         (oVar14 = UpnpFileInfo_get_FileLength(p), oVar14 == -3)) {
        if ((resp_major != 1) || (resp_minor != 1)) {
          iVar6 = 0x196;
          goto LAB_0010f09e;
        }
        RespInstr.IsChunkActive = 1;
      }
      aux_LastModified = UpnpFileInfo_get_LastModified(p);
      pcVar23 = (char *)RespInstr.ReadSendSize;
      if (RespInstr.IsRangeActive == 0) {
        if (RespInstr.IsChunkActive == 0) {
          pSVar17 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
          pcVar15 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
          if (-1 < (long)pcVar23) {
            pcVar31 = (char *)&aux_LastModified;
            fmt = "RNTLADstcSXcECc";
            uVar26 = 200;
            pcVar32 = "redsonic";
            pcVar30 = "LAST-MODIFIED: ";
            goto LAB_001101d3;
          }
          pcVar23 = "RTLADstcSXcECc";
        }
        else {
          pSVar17 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
          pcVar15 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
          pcVar23 = "RKTLADstcSXcECc";
        }
        iVar6 = http_MakeMessage(&headers,resp_major,resp_minor,pcVar23,200,pSVar17,&RespInstr,
                                 &RespInstr,"LAST-MODIFIED: ",&aux_LastModified,"redsonic",pcVar15);
      }
      else {
        if (RespInstr.IsChunkActive == 0) {
          pSVar17 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
          UpnpFileInfo_get_ExtraHeadersList(p);
          pcVar32 = (char *)&aux_LastModified;
          fmt = "RNTGLADstcSXcECc";
          uVar26 = 0xce;
          pcVar15 = "redsonic";
          pcVar31 = "LAST-MODIFIED: ";
          pcVar30 = (char *)&RespInstr;
        }
        else {
          pcVar23 = UpnpFileInfo_get_ContentType(p);
          pcVar15 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
          pcVar31 = (char *)&aux_LastModified;
          fmt = "RTGKLADstcSXcECc";
          uVar26 = 0xce;
          pcVar32 = "redsonic";
          pcVar30 = "LAST-MODIFIED: ";
          pSVar17 = &RespInstr;
        }
LAB_001101d3:
        iVar6 = http_MakeMessage(&headers,resp_major,resp_minor,fmt,uVar26,pcVar23,pSVar17,
                                 &RespInstr,&RespInstr,pcVar30,pcVar31,pcVar32,pcVar15);
      }
      if (iVar6 != 0) {
        local_750 = (char *)0x0;
        iVar6 = 500;
        goto LAB_0010f09e;
      }
      uVar7 = 1;
      if ((char)local_6fc != '\0') {
        uVar7 = (uint)((virtualDirList *)ppvVar27 != (virtualDirList *)0x0) * 3;
      }
      uVar9 = 2;
      if (req->method != HTTPMETHOD_HEAD) {
        uVar9 = uVar7;
      }
      local_750 = (char *)(ulong)uVar9;
      if (req->method == HTTPMETHOD_SIMPLEGET) {
        membuffer_destroy(&headers);
      }
    }
    iVar6 = 200;
    goto LAB_0010f09e;
  }
LAB_0010f085:
  iVar6 = 500;
LAB_0010f09b:
  local_750 = (char *)0x0;
  bVar4 = false;
LAB_0010f09e:
  free(in);
  pUVar11 = UpnpFileInfo_get_ExtraHeadersList(p);
  FreeExtraHTTPHeaders(pUVar11);
  UpnpFileInfo_delete(p);
  if (bVar4 && iVar6 != 200) {
    alias_release(&xmldoc);
  }
  else if (iVar6 == 200) {
    (*(code *)(&DAT_00129a48 + *(int *)(&DAT_00129a48 + (long)local_750 * 4)))();
    return;
  }
  http_SendStatusResponse(local_710,iVar6,req->major_version,req->minor_version);
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/webserver.c",0x71e,
             "webserver: request processed...\n");
  membuffer_destroy(&headers);
  membuffer_destroy(&filename);
  return;
}

Assistant:

void web_server_callback(
	http_parser_t *parser, /* INOUT */ http_message_t *req, SOCKINFO *info)
{
	int ret;
	int timeout = -1;
	enum resp_type rtype = 0;
	membuffer headers;
	membuffer filename;
	struct xml_alias_t xmldoc;
	struct SendInstruction RespInstr;

	/* init */
	memset(&RespInstr, 0, sizeof(RespInstr));
	membuffer_init(&headers);
	membuffer_init(&filename);

	/* Process request should create the different kind of header depending
	 * on the type of request. */
	ret = process_request(
		info, req, &rtype, &headers, &filename, &xmldoc, &RespInstr);
	if (ret != HTTP_OK) {
		/* send error code */
		http_SendStatusResponse(
			info, ret, req->major_version, req->minor_version);
	} else {
		/* send response */
		switch (rtype) {
		case RESP_FILEDOC:
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_XMLDOC:
			http_SendMessage(info,
				&timeout,
				"Ibb",
				&RespInstr,
				headers.buf,
				headers.length,
				xmldoc.doc.buf,
				xmldoc.doc.length);
			alias_release(&xmldoc);
			break;
		case RESP_WEBDOC:
			/*http_SendVirtualDirDoc(info, &timeout, "Ibf",
				&RespInstr,
				headers.buf, headers.length,
				filename.buf);*/
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_HEADERS:
			/* headers only */
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		case RESP_POST:
			/* headers only */
			ret = http_RecvPostMessage(
				parser, info, filename.buf, &RespInstr);
			/* Send response. */
			http_MakeMessage(&headers,
				1,
				1,
				"RTLSXcCc",
				ret,
				"text/html",
				&RespInstr,
				X_USER_AGENT);
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		default:
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"webserver: Invalid response type received.\n");
			assert(0);
		}
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"webserver: request processed...\n");
	membuffer_destroy(&headers);
	membuffer_destroy(&filename);
}